

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argh.h
# Opt level: O1

string_stream * __thiscall
argh::parser::operator()
          (string_stream *__return_storage_ptr__,parser *this,
          initializer_list<const_char_*const> init_list)

{
  istringstream *piVar1;
  long lVar2;
  const_iterator cVar3;
  size_type sVar4;
  bool bVar5;
  allocator local_91;
  istringstream *local_90;
  size_type local_88;
  multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_80;
  iterator local_78;
  undefined1 *local_70;
  long local_68;
  undefined1 local_60 [16];
  key_type local_50;
  
  local_88 = init_list._M_len;
  local_78 = init_list._M_array;
  bVar5 = local_88 == 0;
  local_90 = (istringstream *)__return_storage_ptr__;
  if (!bVar5) {
    local_80 = &this->params_;
    local_88 = local_88 << 3;
    sVar4 = 0;
    do {
      std::__cxx11::string::string((string *)&local_70,*(char **)((long)local_78 + sVar4),&local_91)
      ;
      lVar2 = std::__cxx11::string::find_first_not_of((char)(string *)&local_70,0x2d);
      if (lVar2 == -1) {
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        std::__cxx11::string::_M_construct<char*>((string *)&local_50,local_70,local_70 + local_68);
      }
      else {
        std::__cxx11::string::substr((ulong)&local_50,(ulong)&local_70);
      }
      cVar3 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::find(&local_80->_M_t,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      if (local_70 != local_60) {
        operator_delete(local_70);
      }
      if (&(this->params_)._M_t._M_impl.super__Rb_tree_header != (_Rb_tree_header *)cVar3._M_node) {
        std::__cxx11::istringstream::istringstream(local_90,(string *)(cVar3._M_node + 2),_S_in);
        if (!bVar5) {
          return (string_stream *)local_90;
        }
        break;
      }
      sVar4 = sVar4 + 8;
      bVar5 = local_88 == sVar4;
    } while (!bVar5);
  }
  piVar1 = local_90;
  std::__cxx11::istringstream::istringstream(local_90);
  std::ios::clear((int)piVar1 + (int)*(undefined8 *)(*(long *)piVar1 + -0x18));
  return (string_stream *)local_90;
}

Assistant:

inline string_stream parser::operator()(std::initializer_list<char const* const> init_list) const
   {
      for (auto& name : init_list)
      {
         auto optIt = params_.find(trim_leading_dashes(name));
         if (params_.end() != optIt)
            return string_stream(optIt->second);
      }
      return bad_stream();
   }